

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O0

uint ChompStrlen(char *line)

{
  size_t sVar1;
  uint local_1c;
  uint length;
  char *line_local;
  
  if (line == (char *)0x0) {
    line_local._4_4_ = 0;
  }
  else {
    sVar1 = strlen(line);
    local_1c = (uint)sVar1;
    if ((line[local_1c - 1] == '\n') || (line[local_1c - 1] == '\r')) {
      local_1c = local_1c - 1;
    }
    if ((line[local_1c - 1] == '\n') || (line[local_1c - 1] == '\r')) {
      local_1c = local_1c - 1;
    }
    line_local._4_4_ = local_1c;
  }
  return line_local._4_4_;
}

Assistant:

static unsigned int ChompStrlen(const char* line)
{
  if (line == 0)
    {
    return 0;
    }
  unsigned int  length = static_cast<unsigned int>(strlen(line));
  if ((line[length-1] == '\n') || (line[length-1] == '\r'))
    {
    length--;
    }
  if ((line[length-1] == '\n') || (line[length-1] == '\r'))
    {
    length--;
    }
  return length;
}